

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrLib.cpp
# Opt level: O1

StringBuilder * __thiscall nv::StringBuilder::number(StringBuilder *this,uint i,int base)

{
  int iVar1;
  char *pcVar2;
  float fVar3;
  float fVar4;
  
  if (base < 2) {
    iVar1 = nvAbort("base >= 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvcore/StrLib.cpp"
                    ,0x179,"StringBuilder &nv::StringBuilder::number(uint, int)");
    if (iVar1 == 1) {
      raise(5);
    }
  }
  if (0x24 < base) {
    iVar1 = nvAbort("base <= 36",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvcore/StrLib.cpp"
                    ,0x17a,"StringBuilder &nv::StringBuilder::number(uint, int)");
    if (iVar1 == 1) {
      raise(5);
    }
  }
  fVar3 = logf((float)i);
  fVar4 = logf((float)base);
  reserve(this,(uint)(long)(fVar3 / fVar4 + -0.5 + 1.0));
  pcVar2 = anon_unknown.dwarf_57c759::i2a(i,this->m_str,base);
  *pcVar2 = '\0';
  return this;
}

Assistant:

StringBuilder & StringBuilder::number( uint i, int base )
{
	nvCheck( base >= 2 );
	nvCheck( base <= 36 );

	// @@ This needs to be done correctly.
	// length = floor(log(i, base));
	uint len = uint(log(float(i)) / log(float(base)) - 0.5f + 1);
	reserve(len);

	*i2a(i, m_str, base) = 0;

	return *this;
}